

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockMatcher.cpp
# Opt level: O2

void __thiscall StockMatcher::populateCacheStream(StockMatcher *this)

{
  string textLine;
  value_type local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  while (((&this->field_0x358)[*(long *)(*(long *)&this->m_inputFileStream + -0x18)] & 2) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&this->m_inputFileStream,(string *)&local_40);
    if (local_40._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_cachedStream,&local_40);
    }
  }
  std::ifstream::close();
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void StockMatcher::populateCacheStream()
{
	// This function tries to populate the cache stream from messages of the file and close the file handle. 
	// This is to avoid accessing ifstream in threaded mode since it is not safe and does not seem to work
	// With even locks.

	std::string textLine;
	while(!m_inputFileStream.eof())
	{
		getline(m_inputFileStream, textLine);
		if(textLine.length() > 0)
		{
			m_cachedStream.push_back(textLine);
		}
	}

	m_inputFileStream.close();
}